

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O3

nh_bool ext_cmd_getlin_hook(char *base,void *hook_arg)

{
  int iVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  uint uVar4;
  long lVar5;
  
  iVar1 = *(int *)((long)hook_arg + 0x10);
  if (0 < (long)iVar1) {
    lVar2 = *hook_arg;
    __n = strlen(base);
    uVar4 = 0xffffffff;
    lVar5 = 0;
    do {
      iVar3 = strncasecmp(base,*(char **)(lVar2 + lVar5 * 8),__n);
      if (iVar3 == 0) {
        if (uVar4 != 0xffffffff) {
          return '\0';
        }
        uVar4 = (uint)lVar5;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
    if (-1 < (int)uVar4) {
      strcpy(base,*(char **)(*hook_arg + (ulong)uVar4 * 8));
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

static nh_bool ext_cmd_getlin_hook(char *base, void *hook_arg)
{
    int oindex, com_index;
    struct extcmd_hook_args *hpa = hook_arg;

    com_index = -1;
    for (oindex = 0; oindex < hpa->listlen; oindex++) {
	if (!strncasecmp(base, hpa->namelist[oindex], strlen(base))) {
	    if (com_index == -1)	/* no matches yet */
		com_index = oindex;
	    else			/* more than 1 match */
		return FALSE;
	}
    }
    if (com_index >= 0) {
	strcpy(base, hpa->namelist[com_index]);
	return TRUE;
    }

    return FALSE;	/* didn't match anything */
}